

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

void __thiscall xray_re::xr_memory_writer::w_raw(xr_memory_writer *this,void *data,size_t size)

{
  size_t sVar1;
  size_type sVar2;
  reference __dest;
  size_t size_local;
  void *data_local;
  xr_memory_writer *this_local;
  
  if (size != 0) {
    sVar1 = this->m_pos;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
    if (sVar2 < sVar1 + size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_buffer,this->m_pos + size);
    }
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_buffer,this->m_pos);
    memmove(__dest,data,size);
    this->m_pos = size + this->m_pos;
  }
  return;
}

Assistant:

void xr_memory_writer::w_raw(const void* data, size_t size)
{
	if (size) {
		if (m_pos + size > m_buffer.size())
			m_buffer.resize(m_pos + size);
		std::memmove(&m_buffer[m_pos], data, size);
		m_pos += size;
	}
}